

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

int SimpleBVH::BVH::max_node_index(int node_index,int b,int e)

{
  int *piVar1;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int childr;
  int childl;
  int m;
  int e_local;
  int b_local;
  int node_index_local;
  
  childl = e;
  m = b;
  e_local = node_index;
  if (e <= b) {
    __assert_fail("e > b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xf9,"static int SimpleBVH::BVH::max_node_index(int, int, int)");
  }
  b_local = node_index;
  if (b + 1 != e) {
    childr = b + (e - b) / 2;
    local_20 = node_index << 1;
    local_24 = node_index * 2 + 1;
    local_28 = max_node_index(local_20,b,childr);
    local_2c = max_node_index(local_24,childr,childl);
    piVar1 = std::max<int>(&local_28,&local_2c);
    b_local = *piVar1;
  }
  return b_local;
}

Assistant:

int BVH::max_node_index(int node_index, int b, int e)
{
    assert(e > b);
    if (b + 1 == e) {
        return node_index;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * node_index;
    int childr = 2 * node_index + 1;
    return std::max(max_node_index(childl, b, m), max_node_index(childr, m, e));
}